

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O0

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  IPAddress *this_00;
  char *args;
  undefined4 in_register_00000034;
  string local_38;
  LiteralExpr<flow::util::IPAddress> *local_18;
  IPAddressExpr *ipaddr_local;
  ASTPrinter *this_local;
  
  local_18 = (LiteralExpr<flow::util::IPAddress> *)CONCAT44(in_register_00000034,__fd);
  ipaddr_local = (IPAddressExpr *)this;
  this_00 = LiteralExpr<flow::util::IPAddress>::value(local_18);
  util::IPAddress::str_abi_cxx11_(&local_38,this_00);
  args = (char *)std::__cxx11::string::c_str();
  printf<char_const*>(this,"IPAddressExpr: %s\n",args);
  iVar1 = std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

void ASTPrinter::accept(IPAddressExpr& ipaddr) {
  printf("IPAddressExpr: %s\n", ipaddr.value().str().c_str());
}